

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2212.c
# Opt level: O0

void internal_refresh(SCC *scc)

{
  SCC *scc_local;
  
  if (scc->quality == 0) {
    scc->base_incr = (e_uint32)(long)(((double)scc->clk * 4194304.0) / (double)scc->rate);
  }
  else {
    scc->base_incr = 0x800000;
    scc->realstep = (e_uint32)(0x80000000 / (ulong)scc->rate);
    scc->sccstep = (e_uint32)(0x80000000 / (ulong)(scc->clk >> 1));
    scc->scctime = 0;
  }
  return;
}

Assistant:

static void
internal_refresh (SCC * scc)
{
  if (scc->quality)
  {
    scc->base_incr = 2 << GETA_BITS;
    scc->realstep = (e_uint32) ((1 << 31) / scc->rate);
    scc->sccstep = (e_uint32) ((1 << 31) / (scc->clk / 2));
    scc->scctime = 0;
  }
  else
  {
    scc->base_incr = (e_uint32) ((double) scc->clk * (1 << GETA_BITS) / scc->rate);
  }
}